

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostcheckPass.cpp
# Opt level: O0

PreservedAnalyses * __thiscall
Postcheck::run(PreservedAnalyses *__return_storage_ptr__,Postcheck *this,Module *M,
              ModuleAnalysisManager *AM)

{
  bool bVar1;
  ulong uVar2;
  simple_ilist<llvm::GlobalVariable> *this_00;
  reference this_01;
  reference Val;
  CallGraph *this_02;
  CallGraphNode *node;
  undefined8 uVar3;
  StringRef SVar4;
  CallGraphNode *cgn;
  CallGraph *cg;
  Instruction *I;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *BB;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  StringRef local_128;
  reference local_118;
  GlobalVariable *global;
  iterator __end1_1;
  iterator __begin1_1;
  GlobalListType *__range1_1;
  StringRef local_d0;
  Twine local_c0;
  Twine local_98;
  StringRef local_70;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
  *local_60;
  Function *f;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  __begin1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
  *__range1;
  Function *mainFunc;
  ModuleAnalysisManager *AM_local;
  Module *M_local;
  Postcheck *this_local;
  
  __range1 = (iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
              *)0x0;
  ___begin1 = llvm::Module::functions(M);
  __end1 = llvm::
           iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
           ::begin((iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
                    *)&__begin1);
  f = (Function *)
      llvm::
      iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
      ::end((iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
             *)&__begin1);
  while (bVar1 = llvm::operator!=(&__end1,(ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                                           *)&f), bVar1) {
    local_60 = (iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
                *)llvm::
                  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                  ::operator*(&__end1);
    bVar1 = llvm::Function::isIntrinsic((Function *)local_60);
    if (!bVar1) {
      if (__range1 !=
          (iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
           *)0x0) {
        llvm::report_fatal_error("More than one function in module!",true);
      }
      __range1 = local_60;
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
    ::operator++(&__end1);
  }
  if (__range1 ==
      (iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
       *)0x0) {
    llvm::report_fatal_error("No functions found in module!",true);
  }
  else {
    llvm::StringRef::StringRef(&local_70,"shellvm-main");
    SVar4.Length = (size_t)local_70.Data;
    SVar4.Data = (char *)__range1;
    uVar2 = llvm::Function::hasFnAttribute(SVar4);
    if ((uVar2 & 1) == 0) {
      local_d0 = (StringRef)llvm::Value::getName();
      llvm::operator+(&local_c0,"SheLLVM main function ",&local_d0);
      llvm::Twine::Twine((Twine *)&__range1_1," has no shellvm-main attribute!");
      llvm::operator+(&local_98,&local_c0,(Twine *)&__range1_1);
      llvm::report_fatal_error(&local_98,true);
    }
  }
  this_00 = (simple_ilist<llvm::GlobalVariable> *)llvm::Module::getGlobalList(M);
  __end1_1 = llvm::simple_ilist<llvm::GlobalVariable>::begin(this_00);
  global = (GlobalVariable *)llvm::simple_ilist<llvm::GlobalVariable>::end(this_00);
  while( true ) {
    bVar1 = llvm::operator!=(&__end1_1,
                             (ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
                              *)&global);
    if (!bVar1) break;
    local_118 = llvm::
                ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
                ::operator*(&__end1_1);
    local_128 = llvm::GlobalObject::getSection((GlobalObject *)local_118);
    llvm::StringRef::StringRef((StringRef *)&__range2,"llvm.metadata");
    bVar1 = llvm::StringRef::equals(&local_128,___range2);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      llvm::report_fatal_error("Module has global variables!",true);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
    ::operator++(&__end1_1);
  }
  if (__range1 !=
      (iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
       *)0x0) {
    __end2 = llvm::Function::begin((Function *)__range1);
    BB = (BasicBlock *)llvm::Function::end((Function *)__range1);
    while( true ) {
      bVar1 = llvm::operator!=(&__end2,(ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                                        *)&BB);
      if (!bVar1) break;
      this_01 = llvm::
                ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                ::operator*(&__end2);
      __end3 = llvm::BasicBlock::begin(this_01);
      I = (Instruction *)llvm::BasicBlock::end(this_01);
      while( true ) {
        bVar1 = llvm::operator!=(&__end3,(ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                          *)&I);
        if (!bVar1) break;
        Val = llvm::
              ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
              ::operator*(&__end3);
        bVar1 = llvm::isa<llvm::SwitchInst,llvm::Instruction>(Val);
        if (bVar1) {
          llvm::report_fatal_error("Switch instruction found within main function.",true);
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
        ::operator++(&__end3);
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
      ::operator++(&__end2);
    }
    this_02 = (CallGraph *)operator_new(0x48);
    llvm::CallGraph::CallGraph(this_02,M);
    node = llvm::CallGraph::operator[](this_02,(Function *)__range1);
    bVar1 = dfsTraverse(this,node);
    if (!bVar1) {
      uVar3 = llvm::report_fatal_error
                        ("Non-intrinsic external call found within main function!",true);
      operator_delete(this_02,0x48);
      _Unwind_Resume(uVar3);
    }
  }
  llvm::PreservedAnalyses::all();
  return __return_storage_ptr__;
}

Assistant:

llvm::PreservedAnalyses Postcheck::run(Module &M, ModuleAnalysisManager &AM) {
  // Check 1: Make sure we only have a single function, with the attribute
  // shellvm-main.
  Function *mainFunc = nullptr;

  for (Function &f : M.functions()) {
    if (f.isIntrinsic()) {
      continue;
    }

    if (mainFunc) {
      report_fatal_error("More than one function in module!");
      mainFunc = nullptr;
      continue;
    }

    mainFunc = &f;
  }

  if (!mainFunc) {
    report_fatal_error("No functions found in module!");
  }

  if (mainFunc && !mainFunc->hasFnAttribute("shellvm-main")) {
    report_fatal_error("SheLLVM main function " + mainFunc->getName() +
                       " has no shellvm-main attribute!");
  }

  // Check 2: Make sure there are no globals.
  for (GlobalVariable &global : M.getGlobalList()) {
    if (!global.getSection().equals("llvm.metadata")) {
      report_fatal_error("Module has global variables!");
    }
  }

  // Check 3: No switch instructions allowed in function body.
  if (mainFunc) {
    for (BasicBlock &BB : *mainFunc) {
      for (Instruction &I : BB) {
        if (isa<SwitchInst>(I)) {
          report_fatal_error("Switch instruction found within main function.");
        }
      }
    }

    // Check 4: No external calls (that aren't LLVM intrinsics).
    CallGraph *cg = new CallGraph(M);
    CallGraphNode *cgn = cg->operator[](mainFunc);
    if (!dfsTraverse(cgn)) {
      report_fatal_error(
          "Non-intrinsic external call found within main function!");
    }
  }

  return llvm::PreservedAnalyses::all();
}